

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rtreeRelease(Rtree *pRtree)

{
  long in_RDI;
  sqlite3_stmt *in_stack_00000008;
  
  *(int *)(in_RDI + 0x48) = *(int *)(in_RDI + 0x48) + -1;
  if (*(int *)(in_RDI + 0x48) == 0) {
    *(undefined1 *)(in_RDI + 0x28) = 0;
    nodeBlobReset(pRtree);
    sqlite3_finalize(in_stack_00000008);
    sqlite3_finalize(in_stack_00000008);
    sqlite3_finalize(in_stack_00000008);
    sqlite3_finalize(in_stack_00000008);
    sqlite3_finalize(in_stack_00000008);
    sqlite3_finalize(in_stack_00000008);
    sqlite3_finalize(in_stack_00000008);
    sqlite3_finalize(in_stack_00000008);
    sqlite3_finalize(in_stack_00000008);
    sqlite3_free((void *)0x299b4b);
    sqlite3_free((void *)0x299b54);
  }
  return;
}

Assistant:

static void rtreeRelease(Rtree *pRtree){
  pRtree->nBusy--;
  if( pRtree->nBusy==0 ){
    pRtree->inWrTrans = 0;
    assert( pRtree->nCursor==0 );
    nodeBlobReset(pRtree);
    assert( pRtree->nNodeRef==0 || pRtree->bCorrupt );
    sqlite3_finalize(pRtree->pWriteNode);
    sqlite3_finalize(pRtree->pDeleteNode);
    sqlite3_finalize(pRtree->pReadRowid);
    sqlite3_finalize(pRtree->pWriteRowid);
    sqlite3_finalize(pRtree->pDeleteRowid);
    sqlite3_finalize(pRtree->pReadParent);
    sqlite3_finalize(pRtree->pWriteParent);
    sqlite3_finalize(pRtree->pDeleteParent);
    sqlite3_finalize(pRtree->pWriteAux);
    sqlite3_free(pRtree->zReadAuxSql);
    sqlite3_free(pRtree);
  }
}